

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O2

double gmath::transformGaussJordan(Matrixd *a)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  double *pdVar5;
  long lVar6;
  int i;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double *pdVar15;
  long lVar16;
  int iVar17;
  int k;
  double *pdVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  double v;
  double dVar22;
  double dVar23;
  double *local_68;
  long local_50;
  
  uVar3 = a->nrows;
  uVar4 = a->ncols;
  lVar6 = (long)(int)uVar4;
  pdVar5 = a->v;
  uVar11 = 0;
  uVar13 = 0;
  if (0 < (int)uVar4) {
    uVar13 = (ulong)uVar4;
  }
  uVar14 = 0;
  if (0 < (int)uVar3) {
    uVar14 = (ulong)uVar3;
  }
  pdVar15 = pdVar5;
  dVar23 = 0.0;
  for (; uVar11 != uVar14; uVar11 = uVar11 + 1) {
    dVar22 = 0.0;
    for (uVar10 = 0; uVar13 != uVar10; uVar10 = uVar10 + 1) {
      dVar22 = dVar22 + ABS(pdVar15[uVar10]);
    }
    if (dVar22 <= dVar23) {
      dVar22 = dVar23;
    }
    pdVar15 = pdVar15 + lVar6;
    dVar23 = dVar22;
  }
  uVar7 = uVar4;
  if ((int)uVar4 < (int)uVar3) {
    uVar7 = uVar3;
  }
  uVar8 = uVar3;
  if ((int)uVar4 < (int)uVar3) {
    uVar8 = uVar4;
  }
  uVar13 = 0;
  uVar11 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar11 = uVar13;
  }
  dVar22 = 1.0;
  iVar17 = 1;
  local_50 = 0;
  uVar10 = 0;
  uVar21 = (ulong)uVar4;
  pdVar15 = pdVar5;
  local_68 = pdVar5;
  while( true ) {
    uVar12 = uVar10 & 0xffffffff;
    uVar20 = uVar10;
    if ((int)uVar10 < (int)uVar4) {
      uVar12 = (ulong)uVar4;
      uVar20 = (ulong)uVar4;
    }
    if (uVar10 == uVar11) {
      return dVar22;
    }
    lVar16 = (long)iVar17;
    pdVar18 = (double *)(lVar6 * 8 * lVar16 + local_50 + (long)a->v);
    uVar19 = uVar10 & 0xffffffff;
    for (; uVar8 = (uint)uVar19, lVar16 < (int)uVar3; lVar16 = lVar16 + 1) {
      uVar9 = (uint)lVar16;
      if (ABS(*pdVar18) <= ABS(a->v[uVar10 + (long)(int)(uVar8 * uVar4)])) {
        uVar9 = uVar8;
      }
      pdVar18 = pdVar18 + lVar6;
      uVar19 = (ulong)uVar9;
    }
    lVar16 = (long)(int)(uVar8 * uVar4);
    if (ABS(pdVar5[uVar10 + lVar16]) < dVar23 * (double)(int)uVar7 * 2.220446049250313e-16) break;
    if (uVar10 != uVar19) {
      for (uVar19 = 0; uVar21 != uVar19; uVar19 = uVar19 + 1) {
        dVar1 = pdVar15[uVar19];
        pdVar15[uVar19] = local_68[lVar16 + uVar19];
        local_68[lVar16 + uVar19] = dVar1;
      }
      dVar22 = -dVar22;
    }
    dVar1 = pdVar5[uVar10 + (long)(int)(uVar4 * (int)uVar10)];
    for (lVar16 = 0; (uVar20 & 0xffffffff) + uVar13 != lVar16; lVar16 = lVar16 + 1) {
      pdVar15[lVar16] = pdVar15[lVar16] / dVar1;
    }
    pdVar18 = local_68;
    for (uVar20 = 0; uVar20 != uVar14; uVar20 = uVar20 + 1) {
      if (uVar20 != uVar10) {
        dVar2 = pdVar5[uVar10 + uVar20 * lVar6];
        for (lVar16 = 0; uVar12 + uVar13 != lVar16; lVar16 = lVar16 + 1) {
          pdVar18[lVar16] = pdVar15[lVar16] * -dVar2 + pdVar18[lVar16];
        }
      }
      pdVar18 = pdVar18 + lVar6;
    }
    dVar22 = dVar22 * dVar1;
    iVar17 = iVar17 + 1;
    local_50 = local_50 + 8;
    local_68 = local_68 + 1;
    pdVar15 = pdVar15 + lVar6 + 1;
    uVar21 = uVar21 - 1;
    uVar13 = uVar13 - 1;
    uVar10 = uVar10 + 1;
  }
  return 0.0;
}

Assistant:

double transformGaussJordan(Matrixd &a)
{
  double ret=1;

  // compute a meaningful epsilon

  double eps=0;

  for (int k=0; k<a.rows(); k++)
  {
    double v=0;

    for (int i=0; i<a.cols(); i++)
    {
      v+=std::abs(a(k, i));
    }

    eps=std::max(eps, v);
  }

  int n=std::max(a.rows(), a.cols());

  eps*=n;
  eps*=pow(2, -52);

  // for all rows

  n=std::min(a.rows(), a.cols());

  for (int j=0; j<n; j++)
  {
    // find pivot element

    int pivot=j;

    for (int k=j+1; k<a.rows(); k++)
    {
      if (std::abs(a(k, j)) > std::abs(a(pivot, j)))
      {
        pivot=k;
      }
    }

    // stop, if pivot element is 0

    if (std::abs(a(pivot, j)) < eps)
    {
      ret=0;
      break;
    }

    // interchange line j with line with pivot element

    if (pivot != j)
    {
      for (int i=j; i<a.cols(); i++)
      {
        double v=a(j, i);
        a(j, i)=a(pivot, i);
        a(pivot, i)=v;
      }

      ret*=-1;
    }

    pivot=j;

    // scale pivot line such that the pivot element becomes 1

    double s=a(pivot, pivot);

    for (int i=pivot; i<a.cols(); i++)
    {
      a(pivot, i)/=s;
    }

    ret*=s;

    // eliminate all elements of the pivot column except the pivot
    // element

    for (int k=0; k<a.rows(); k++)
    {
      if (k != pivot)
      {
        double v=a(k, pivot);

        for (int i=pivot; i<a.cols(); i++)
        {
          a(k, i)-=v*a(pivot, i);
        }
      }
    }
  }

  return ret;
}